

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.h
# Opt level: O0

t_value<xemmai::t_pointer> __thiscall
xemmai::t_value<xemmai::t_pointer>::f_invoke<>
          (t_value<xemmai::t_pointer> *this,t_object *a_key,size_t *a_index)

{
  t_pvalue *ptVar1;
  t_pvalue *in_RCX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  t_value<xemmai::t_pointer> tVar2;
  t_scoped_stack local_30;
  t_scoped_stack stack;
  size_t *a_index_local;
  t_object *a_key_local;
  t_value<xemmai::t_pointer> *this_local;
  
  stack.v_p = in_RCX;
  t_scoped_stack::t_scoped_stack(&local_30,2);
  ptVar1 = t_scoped_stack::operator_cast_to_t_value_(&local_30);
  xemmai::t_pointer::operator=(&ptVar1[1].super_t_pointer,(t_object *)0x0);
  ptVar1 = t_scoped_stack::operator_cast_to_t_value_(&local_30);
  f_call((t_value<xemmai::t_pointer> *)a_key,(t_object *)a_index,(size_t *)stack.v_p,ptVar1,0);
  ptVar1 = t_scoped_stack::operator_cast_to_t_value_(&local_30);
  t_value(this,ptVar1);
  t_scoped_stack::~t_scoped_stack(&local_30);
  tVar2.field_0.v_integer = extraout_RDX.v_integer;
  tVar2.super_t_pointer.v_p = (t_object *)this;
  return tVar2;
}

Assistant:

inline t_pvalue t_value<T_tag>::f_invoke(t_object* a_key, size_t& a_index, auto&&... a_arguments) const
{
	t_scoped_stack stack(sizeof...(a_arguments) + 2, std::forward<decltype(a_arguments)>(a_arguments)...);
	stack[1] = nullptr;
	f_call(a_key, a_index, stack, sizeof...(a_arguments));
	return stack[0];
}